

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_syncLPReal(SoPlexBase<double> *this,bool time)

{
  undefined7 in_register_00000031;
  SPxLPBase<double> SStack_1e8;
  
  if ((int)CONCAT71(in_register_00000031,time) != 0) {
    (*this->_statistics->syncTime->_vptr_Timer[3])();
  }
  if (this->_isRealLPLoaded == true) {
    SPxLPBase<double>::
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              (&SStack_1e8,this->_rationalLP);
    SPxSolverBase<double>::loadLP(&this->_solver,&SStack_1e8,true);
    SPxLPBase<double>::~SPxLPBase(&SStack_1e8);
  }
  else {
    SPxLPBase<double>::operator=(this->_realLP,this->_rationalLP);
  }
  this->_hasBasis = false;
  SLUFactorRational::clear(&this->_rationalLUSolver);
  if (time) {
    (*this->_statistics->syncTime->_vptr_Timer[4])();
  }
  return;
}

Assistant:

void SoPlexBase<R>::_syncLPReal(bool time)
{
   // start timing
   if(time)
      _statistics->syncTime->start();

   // copy LP
   if(_isRealLPLoaded)
      _solver.loadLP((SPxLPBase<R>)(*_rationalLP));
   else
      *_realLP = *_rationalLP;

   ///@todo try loading old basis
   _hasBasis = false;
   _rationalLUSolver.clear();

   // stop timing
   if(time)
      _statistics->syncTime->stop();
}